

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O3

void lua_settop(lua_State *L,int idx)

{
  StkId pTVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  StkId pTVar5;
  int *piVar6;
  ulong uVar7;
  StkId pTVar8;
  ulong uVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  
  auVar4 = _DAT_0011d290;
  auVar3 = _DAT_0011d280;
  auVar2 = _DAT_0011d270;
  if (idx < 0) {
    if ((long)L->top - (long)L->base >> 4 < (long)(ulong)(uint)~idx) {
      __assert_fail("-(idx+1) <= (L->top - L->base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cuberite[P]lua/src/lapi.cpp"
                    ,0xad,"void lua_settop(lua_State *, int)");
    }
    pTVar5 = L->top + (long)idx + 1;
  }
  else {
    if ((long)L->stack_last - (long)L->base >> 4 < (long)(ulong)(uint)idx) {
      __assert_fail("idx <= L->stack_last - L->base",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cuberite[P]lua/src/lapi.cpp"
                    ,0xa7,"void lua_settop(lua_State *, int)");
    }
    pTVar5 = L->base + (uint)idx;
    pTVar1 = L->top;
    if (pTVar1 < pTVar5) {
      pTVar8 = pTVar1 + 1;
      if (pTVar1 + 1 < pTVar5) {
        pTVar8 = pTVar5;
      }
      uVar7 = (long)&pTVar8->value + ~(ulong)pTVar1;
      auVar13._8_4_ = (int)uVar7;
      auVar13._0_8_ = uVar7;
      auVar13._12_4_ = (int)(uVar7 >> 0x20);
      auVar10._0_8_ = uVar7 >> 4;
      auVar10._8_8_ = auVar13._8_8_ >> 4;
      piVar6 = &pTVar1[3].tt;
      uVar9 = 0;
      auVar10 = auVar10 ^ _DAT_0011d290;
      do {
        auVar12._8_4_ = (int)uVar9;
        auVar12._0_8_ = uVar9;
        auVar12._12_4_ = (int)(uVar9 >> 0x20);
        auVar13 = (auVar12 | auVar3) ^ auVar4;
        iVar11 = auVar10._4_4_;
        if ((bool)(~(auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_ ||
                    iVar11 < auVar13._4_4_) & 1)) {
          piVar6[-0xc] = 0;
        }
        if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
            auVar13._12_4_ <= auVar10._12_4_) {
          piVar6[-8] = 0;
        }
        auVar13 = (auVar12 | auVar2) ^ auVar4;
        iVar14 = auVar13._4_4_;
        if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar13._0_4_ <= auVar10._0_4_)) {
          piVar6[-4] = 0;
          *piVar6 = 0;
        }
        uVar9 = uVar9 + 4;
        piVar6 = piVar6 + 0x10;
      } while (((uVar7 >> 4) + 4 & 0xfffffffffffffffc) != uVar9);
    }
  }
  L->top = pTVar5;
  return;
}

Assistant:

LUA_API void lua_settop (lua_State *L, int idx) {
  lua_lock(L);
  if (idx >= 0) {
    api_check(L, idx <= L->stack_last - L->base);
    while (L->top < L->base + idx)
      setnilvalue(L->top++);
    L->top = L->base + idx;
  }
  else {
    api_check(L, -(idx+1) <= (L->top - L->base));
    L->top += idx+1;  /* `subtract' index (index is negative) */
  }
  lua_unlock(L);
}